

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3002:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3002:34)>
          *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ConfigData *pCVar2;
  int iVar3;
  ReporterSpec *spec;
  ReporterSpec *pRVar4;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var;
  ReporterRegistryImpl *pRVar6;
  const_iterator cVar7;
  pointer pRVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  StringRef reporterSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ReporterSpec> parsed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Optional<Catch::ReporterSpec> local_e8;
  BasicResult<Catch::Clara::ParseResultType> local_58;
  
  this_00 = &bStack_148;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_108);
  local_58.m_errorMessage._M_dataplus._M_p = (pointer)&local_58.m_errorMessage.field_2;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_002f3d40;
  local_58.m_errorMessage._M_string_length = 0;
  local_58.m_errorMessage.field_2._M_local_buf[0] = '\0';
  if (local_108._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Received empty reporter spec.",(allocator<char> *)&bStack_148);
    BasicResult<Catch::Clara::ParseResultType>::runtimeError
              (__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    goto LAB_00165f75;
  }
  reporterSpec.m_size = local_108._M_string_length;
  reporterSpec.m_start = local_108._M_dataplus._M_p;
  parseReporterSpec(&local_e8,reporterSpec);
  if (local_e8.nullableValue == (ReporterSpec *)0x0) {
    std::operator+(&local_128,"Could not parse reporter spec \'",&local_108);
    std::operator+(&bStack_148,&local_128,"\'");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
LAB_00165f39:
    std::__cxx11::string::~string((string *)&bStack_148);
    this_00 = &local_128;
LAB_00165f46:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    pRVar4 = Optional<Catch::ReporterSpec>::operator*(&local_e8);
    pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar3 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar5);
    pRVar6 = Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                       ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)
                        CONCAT44(extraout_var,iVar3));
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
            ::find(&(pRVar6->factories)._M_t,&pRVar4->m_name);
    if ((_Rb_tree_header *)cVar7._M_node == &(pRVar6->factories)._M_t._M_impl.super__Rb_tree_header)
    {
      std::operator+(&local_128,"Unrecognized reporter, \'",&pRVar4->m_name);
      std::operator+(&bStack_148,&local_128,"\'. Check available with --list-reporters");
      BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
      goto LAB_00165f39;
    }
    pbVar1 = (pRVar4->m_outputFileName).nullableValue;
    pCVar2 = (this->m_lambda).config;
    pRVar4 = Optional<Catch::ReporterSpec>::operator*(&local_e8);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>(&pCVar2->reporterSpecifications,pRVar4);
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pCVar2 = (this->m_lambda).config;
      uVar9 = 0;
      for (pRVar8 = (pCVar2->reporterSpecifications).
                    super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar8 != (pCVar2->reporterSpecifications).
                    super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pRVar8 = pRVar8 + 1) {
        uVar9 = uVar9 + ((pRVar8->m_outputFileName).nullableValue ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      if (uVar9 < 2) goto LAB_00165f52;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_148,"Only one reporter may have unspecified output file.",
                 (allocator<char> *)&local_128);
      BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&bStack_148);
      goto LAB_00165f46;
    }
LAB_00165f52:
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  Optional<Catch::ReporterSpec>::reset(&local_e8);
LAB_00165f75:
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_58);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }